

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O3

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  jpeg_c_coef_controller *pjVar1;
  JCOEF JVar2;
  JDIMENSION JVar3;
  JDIMENSION JVar4;
  jpeg_c_coef_controller *pjVar5;
  jpeg_component_info *pjVar6;
  int iVar7;
  int iVar8;
  boolean bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  JDIMENSION JVar17;
  long lVar18;
  int iVar9;
  
  pjVar5 = cinfo->coef;
  iVar14 = *(int *)&pjVar5[1].compress_data;
  iVar7 = *(int *)((long)&pjVar5[1].compress_data + 4);
  if (iVar14 < iVar7) {
    JVar3 = cinfo->total_iMCU_rows;
    uVar11 = cinfo->MCUs_per_row - 1;
    pjVar1 = pjVar5 + 2;
    uVar13 = *(uint *)((long)&pjVar5[1].start_pass + 4);
    do {
      if (uVar13 <= uVar11) {
        do {
          iVar7 = cinfo->comps_in_scan;
          if (0 < iVar7) {
            lVar16 = 0;
            iVar8 = 0;
            do {
              pjVar6 = cinfo->cur_comp_info[lVar16];
              if (0 < pjVar6->MCU_height) {
                JVar4 = (&pjVar6->MCU_width)[(ulong)(uVar11 <= uVar13) * 4];
                iVar7 = pjVar6->MCU_sample_width;
                iVar12 = 0;
                JVar17 = iVar14 * 8;
                do {
                  lVar18 = (long)iVar8;
                  if ((*(uint *)&pjVar5[1].start_pass < JVar3 - 1) ||
                     (iVar14 + iVar12 < pjVar6->last_row_height)) {
                    (*cinfo->fdct->forward_DCT)
                              (cinfo,pjVar6,input_buf[pjVar6->component_index],
                               (JBLOCKROW)(&pjVar1->start_pass)[lVar18],JVar17,iVar7 * uVar13,JVar4)
                    ;
                    iVar9 = pjVar6->MCU_width;
                    if ((int)JVar4 < iVar9) {
                      jzero_far((JBLOCKROW)(&pjVar1->start_pass)[(int)(iVar8 + JVar4)],
                                (long)(int)(iVar9 - JVar4) << 7);
                      iVar9 = pjVar6->MCU_width;
                      if ((int)JVar4 < iVar9) {
                        lVar15 = (long)(int)JVar4;
                        do {
                          (*(JBLOCKROW)(&pjVar1->start_pass)[lVar18 + lVar15])[0] =
                               **(JCOEF **)((long)pjVar1 + lVar15 * 8 + lVar18 * 8 + -8);
                          lVar15 = lVar15 + 1;
                        } while (iVar9 != lVar15);
                      }
                    }
                  }
                  else {
                    jzero_far((JBLOCKROW)(&pjVar1->start_pass)[lVar18],(long)pjVar6->MCU_width << 7)
                    ;
                    iVar9 = pjVar6->MCU_width;
                    if (0 < (long)iVar9) {
                      JVar2 = *(JCOEF *)(&pjVar5[1].compress_data)[lVar18];
                      lVar15 = 0;
                      do {
                        (*(JBLOCKROW)(&pjVar1->start_pass)[lVar18 + lVar15])[0] = JVar2;
                        lVar15 = lVar15 + 1;
                      } while (iVar9 != lVar15);
                    }
                  }
                  iVar8 = iVar9 + iVar8;
                  JVar17 = JVar17 + 8;
                  iVar12 = iVar12 + 1;
                } while (iVar12 < pjVar6->MCU_height);
                iVar7 = cinfo->comps_in_scan;
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < iVar7);
          }
          bVar10 = (*cinfo->entropy->encode_mcu)(cinfo,(JBLOCKROW *)pjVar1);
          if (bVar10 == 0) {
            *(int *)&pjVar5[1].compress_data = iVar14;
            *(uint *)((long)&pjVar5[1].start_pass + 4) = uVar13;
            return 0;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 <= uVar11);
        iVar7 = *(int *)((long)&pjVar5[1].compress_data + 4);
      }
      *(undefined4 *)((long)&pjVar5[1].start_pass + 4) = 0;
      iVar14 = iVar14 + 1;
      uVar13 = 0;
    } while (iVar14 < iVar7);
  }
  *(int *)&pjVar5[1].start_pass = *(int *)&pjVar5[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_data(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION MCU_col_num;       /* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
         MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
        compptr = cinfo->cur_comp_info[ci];
        blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width :
                                                  compptr->last_col_width;
        xpos = MCU_col_num * compptr->MCU_sample_width;
        ypos = yoffset * DCTSIZE; /* ypos == (yoffset+yindex) * DCTSIZE */
        for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
          if (coef->iMCU_row_num < last_iMCU_row ||
              yoffset + yindex < compptr->last_row_height) {
            (*cinfo->fdct->forward_DCT) (cinfo, compptr,
                                         input_buf[compptr->component_index],
                                         coef->MCU_buffer[blkn],
                                         ypos, xpos, (JDIMENSION)blockcnt);
            if (blockcnt < compptr->MCU_width) {
              /* Create some dummy blocks at the right edge of the image. */
              jzero_far((void *)coef->MCU_buffer[blkn + blockcnt],
                        (compptr->MCU_width - blockcnt) * sizeof(JBLOCK));
              for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
                coef->MCU_buffer[blkn + bi][0][0] =
                  coef->MCU_buffer[blkn + bi - 1][0][0];
              }
            }
          } else {
            /* Create a row of dummy blocks at the bottom of the image. */
            jzero_far((void *)coef->MCU_buffer[blkn],
                      compptr->MCU_width * sizeof(JBLOCK));
            for (bi = 0; bi < compptr->MCU_width; bi++) {
              coef->MCU_buffer[blkn + bi][0][0] =
                coef->MCU_buffer[blkn - 1][0][0];
            }
          }
          blkn += compptr->MCU_width;
          ypos += DCTSIZE;
        }
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (!(*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
        /* Suspension forced; update state counters and exit */
        coef->MCU_vert_offset = yoffset;
        coef->mcu_ctr = MCU_col_num;
        return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}